

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O2

void __thiscall
Saturation::PredicateSplitPassiveClauseContainer::PredicateSplitPassiveClauseContainer
          (PredicateSplitPassiveClauseContainer *this,bool isOutermost,Options *opt,string *name,
          vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
          *queues,vector<float,_std::allocator<float>_> *cutoffs,
          vector<int,_std::allocator<int>_> ratios,bool layeredArrangement)

{
  bool bVar1;
  pointer puVar2;
  int a;
  long lVar3;
  UserErrorException *pUVar4;
  long lVar5;
  unsigned_long i;
  unsigned_long i_00;
  unsigned_long i_01;
  unsigned_long i_02;
  uint uVar6;
  uint ri;
  vector<float,_std::allocator<float>_> *local_138;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  PassiveClauseContainer::PassiveClauseContainer
            (&this->super_PassiveClauseContainer,isOutermost,opt,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.super_ClauseContainer.
  _vptr_ClauseContainer = (_func_int **)&PTR__PredicateSplitPassiveClauseContainer_00a013c8;
  (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (queues->
           super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->_queues).
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (queues->
       super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->_queues).
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar2;
  (this->_queues).
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (queues->
       super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (queues->
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (queues->
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (queues->
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138 = &this->_cutoffs;
  std::vector<float,_std::allocator<float>_>::vector(local_138,cutoffs);
  (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_invertedRatios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_invertedRatios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_invertedRatios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_layeredArrangement =
       ratios.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_1_;
  (this->_simulationBalances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_simulationBalances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_simulationBalances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = (bool)(opt->_randomAWR).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92;
  this->_randomize = bVar1;
  lVar5 = *(long *)ratios.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  lVar3 = *(long *)(ratios.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + 2);
  if (lVar3 - lVar5 >> 2 !=
      (long)(this->_queues).
            super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->_queues).
            super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3) {
    pUVar4 = (UserErrorException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_f0,"Queue ",name);
    std::operator+(&local_d0,&local_f0,
                   ": The number of ratios needs to match the number of queues, but ");
    Lib::Int::toString_abi_cxx11_
              (&local_110,
               (Int *)(*(long *)(ratios.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + 2) -
                       *(long *)ratios.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2),i);
    std::operator+(&local_b0,&local_d0,&local_110);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ri,
                   &local_b0," != ");
    Lib::Int::toString_abi_cxx11_
              (&local_130,
               (Int *)((long)(this->_queues).
                             super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_queues).
                             super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3),i_00);
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ri,
                   &local_130);
    Lib::UserErrorException::Exception(pUVar4,&local_70);
    __cxa_throw(pUVar4,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  if ((long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start == lVar3 - lVar5) {
    if (bVar1 != false) {
      this->_ratioSum = 0;
      for (uVar6 = 0; (ulong)uVar6 < (ulong)(lVar3 - lVar5 >> 2); uVar6 = uVar6 + 1) {
        ri = *(uint *)(lVar5 + (ulong)uVar6 * 4);
        this->_ratioSum = this->_ratioSum + ri;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->_ratios,&ri);
        lVar5 = *(long *)ratios.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        lVar3 = *(long *)(ratios.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + 2);
      }
    }
    uVar6 = 0;
    a = 1;
    while( true ) {
      if ((ulong)(lVar3 - lVar5 >> 2) <= (ulong)uVar6) break;
      a = computeLCM(a,*(int *)(lVar5 + (ulong)uVar6 * 4));
      uVar6 = uVar6 + 1;
      lVar5 = *(long *)ratios.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
      lVar3 = *(long *)(ratios.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + 2);
    }
    for (uVar6 = 0; (ulong)uVar6 < (ulong)(lVar3 - lVar5 >> 2); uVar6 = uVar6 + 1) {
      ri = a / *(int *)(lVar5 + (ulong)uVar6 * 4);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&this->_invertedRatios,&ri);
      ri = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&this->_balances,&ri);
      lVar5 = *(long *)ratios.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
      lVar3 = *(long *)(ratios.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + 2);
    }
    return;
  }
  pUVar4 = (UserErrorException *)__cxa_allocate_exception(0x50);
  std::operator+(&local_f0,"Queue ",name);
  std::operator+(&local_d0,&local_f0,
                 ": The number of cutoffs needs to match the number of queues, but ");
  Lib::Int::toString_abi_cxx11_
            (&local_110,
             (Int *)((long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2),i_01);
  std::operator+(&local_b0,&local_d0,&local_110);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ri,&local_b0,
                 " != ");
  Lib::Int::toString_abi_cxx11_
            (&local_130,
             (Int *)((long)(this->_queues).
                           super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_queues).
                           super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3),i_02);
  std::operator+(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ri,
                 &local_130);
  Lib::UserErrorException::Exception(pUVar4,&local_90);
  __cxa_throw(pUVar4,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException
             );
}

Assistant:

PredicateSplitPassiveClauseContainer::PredicateSplitPassiveClauseContainer(bool isOutermost, const Shell::Options& opt, std::string name,
    std::vector<std::unique_ptr<PassiveClauseContainer>> queues,
    std::vector<float> cutoffs, std::vector<int> ratios, bool layeredArrangement)
  : PassiveClauseContainer(isOutermost, opt, name), _queues(std::move(queues)), _cutoffs(cutoffs), _layeredArrangement(layeredArrangement)
{
  _randomize = opt.randomAWR();

  // sanity checks
  if (ratios.size() != _queues.size()) {
    USER_ERROR("Queue " + name + ": The number of ratios needs to match the number of queues, but " + Int::toString(ratios.size()) + " != " + Int::toString(_queues.size()));
  }
  if (_cutoffs.size() != _queues.size()) {
    USER_ERROR("Queue " + name + ": The number of cutoffs needs to match the number of queues, but " + Int::toString(_cutoffs.size()) + " != " + Int::toString(_queues.size()));
  }

  if (_randomize) {
    _ratioSum = 0;
    for (unsigned i = 0; i < ratios.size(); i++) {
      unsigned ri = ratios[i];
      _ratioSum += ri;
      _ratios.push_back(ri);
    }
  }

  // even when randomizing true selection, we rely on the old ways for simulation:

  // compute lcm, which will be used to compute reverse ratios
  auto lcm = 1;
  for (unsigned i = 0; i < ratios.size(); i++)
  {
    lcm = computeLCM(lcm, ratios[i]);
  }
  // initialize
  for (unsigned i = 0; i < ratios.size(); i++)
  {
    _invertedRatios.push_back(lcm / ratios[i]);
    _balances.push_back(0);
  }
}